

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

OSSL_HTTP_REQ_CTX *
http_req_ctx_new(int free_wbio,BIO *wbio,BIO *rbio,OSSL_HTTP_bio_cb_t bio_update_fn,void *arg,
                int use_ssl,char *proxy,char *server,char *port,int buf_size,int overall_timeout)

{
  char *pcVar1;
  time_t tVar2;
  BIO *in_RCX;
  int in_EDI;
  BIO *in_R8;
  int in_R9D;
  OSSL_HTTP_REQ_CTX *rctx;
  undefined4 in_stack_00000010;
  time_t local_48;
  OSSL_HTTP_REQ_CTX *local_8;
  
  local_8 = OSSL_HTTP_REQ_CTX_new(in_RCX,in_R8,in_R9D);
  if (local_8 == (OSSL_HTTP_REQ_CTX *)0x0) {
    return (OSSL_HTTP_REQ_CTX *)0x0;
  }
  local_8->free_wbio = in_EDI;
  local_8->upd_fn = (OSSL_HTTP_bio_cb_t)in_RCX;
  local_8->upd_arg = in_R8;
  local_8->use_ssl = in_R9D;
  if (rctx == (OSSL_HTTP_REQ_CTX *)0x0) {
LAB_0043c5dc:
    if (CONCAT44(use_ssl,in_stack_00000010) != 0) {
      pcVar1 = CRYPTO_strdup((char *)CONCAT44(use_ssl,in_stack_00000010),"crypto/http/http_client.c"
                             ,0x164);
      local_8->server = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_0043c67c;
    }
    if (arg != (void *)0x0) {
      pcVar1 = CRYPTO_strdup((char *)arg,"crypto/http/http_client.c",0x167);
      local_8->port = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_0043c67c;
    }
    if ((int)rbio < 1) {
      local_48 = 0;
    }
    else {
      tVar2 = time((time_t *)0x0);
      local_48 = tVar2 + (int)rbio;
    }
    local_8->max_total_time = local_48;
  }
  else {
    pcVar1 = CRYPTO_strdup((char *)rctx,"crypto/http/http_client.c",0x161);
    local_8->proxy = pcVar1;
    if (pcVar1 != (char *)0x0) goto LAB_0043c5dc;
LAB_0043c67c:
    OSSL_HTTP_REQ_CTX_free((OSSL_HTTP_REQ_CTX *)0x43c686);
    local_8 = (OSSL_HTTP_REQ_CTX *)0x0;
  }
  return local_8;
}

Assistant:

static OSSL_HTTP_REQ_CTX *http_req_ctx_new(int free_wbio, BIO *wbio, BIO *rbio,
                                           OSSL_HTTP_bio_cb_t bio_update_fn,
                                           void *arg, int use_ssl,
                                           const char *proxy,
                                           const char *server, const char *port,
                                           int buf_size, int overall_timeout)
{
    OSSL_HTTP_REQ_CTX *rctx = OSSL_HTTP_REQ_CTX_new(wbio, rbio, buf_size);

    if (rctx == NULL)
        return NULL;
    rctx->free_wbio = free_wbio;
    rctx->upd_fn = bio_update_fn;
    rctx->upd_arg = arg;
    rctx->use_ssl = use_ssl;
    if (proxy != NULL
            && (rctx->proxy = OPENSSL_strdup(proxy)) == NULL)
        goto err;
    if (server != NULL
            && (rctx->server = OPENSSL_strdup(server)) == NULL)
        goto err;
    if (port != NULL
            && (rctx->port = OPENSSL_strdup(port)) == NULL)
        goto err;
    rctx->max_total_time =
        overall_timeout > 0 ? time(NULL) + overall_timeout : 0;
    return rctx;

 err:
    OSSL_HTTP_REQ_CTX_free(rctx);
    return NULL;
}